

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNextFreeFidForATwoEntryDataDictionaryIsOneMoreThanTheLargestExistingFid_Test
::TestBody(ExtendedDataDictionaryTest_TestNextFreeFidForATwoEntryDataDictionaryIsOneMoreThanTheLargestExistingFid_Test
           *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  AssertHelper local_e8;
  AssertionResult gtest_ar;
  FieldDef local_d0 [8];
  string local_c8 [40];
  FieldDef local_a0 [8];
  string local_98 [40];
  ExtendableDataDictionary dataDictionary;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  
  local_50 = &uStack_60;
  _dataDictionary = bidfx_public_api::tools::ByteBuffer::WriteShort;
  local_58 = 0;
  uStack_60 = 0;
  local_20 = &local_30;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_10 = 0;
  local_48 = local_50;
  local_18 = local_20;
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_a0,(FieldDef *)&ask2);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(&dataDictionary,local_a0);
  std::__cxx11::string::~string(local_98);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_d0,(FieldDef *)&ask_size2);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(&dataDictionary,local_d0);
  std::__cxx11::string::~string(local_c8);
  local_f0.ptr_._0_4_ = ask_size2 + 1;
  local_e8.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"ask_size2.fid_ + 1","dataDictionary.NextFreeFid()",
             (int *)&local_f0,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0xbc,message);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ExtendableDataDictionary::~ExtendableDataDictionary(&dataDictionary);
  return;
}

Assistant:

ExtendableDataDictionary CreateExtendableDataDictionary()
{
    ExtendableDataDictionary result = ExtendableDataDictionary();
    result.AddFieldDef(bid2);
    result.AddFieldDef(ask2);
    result.AddFieldDef(bid_size2);
    result.AddFieldDef(ask_size2);
    result.AddFieldDef(status2);
    return result;
}